

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void tscpm_linear_transform
               (pel *pSrc,int iSrcStride,pel *pDst,int iDstStride,int a_u,int b_u,int a_v,int b_v,
               int iShift,int uiWidth,int uiHeight,int bitDept)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar11 = ~(-1 << ((byte)bitDept & 0x1f));
  uVar8 = 0;
  if (iShift < 1) {
    iShift = 0;
  }
  uVar10 = (ulong)(uint)uiWidth;
  if (uiWidth < 1) {
    uVar10 = uVar8;
  }
  if (uiHeight < 1) {
    uiHeight = 0;
  }
  for (iVar2 = 0; iVar2 != uiHeight; iVar2 = iVar2 + 1) {
    lVar6 = 0;
    iVar5 = 1;
    for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      uVar7 = (int)((long)((ulong)pSrc[uVar4] * (long)a_u) >> ((byte)iShift & 0x3f)) + b_u;
      uVar1 = uVar7;
      if ((int)uVar11 <= (int)uVar7) {
        uVar1 = uVar11;
      }
      uVar9 = (int)((long)((ulong)pSrc[uVar4] * (long)a_v) >> ((byte)iShift & 0x3f)) + b_v;
      uVar3 = (ulong)uVar1;
      if ((int)uVar7 < 0) {
        uVar3 = uVar8;
      }
      pDst[lVar6 >> 0x20] = (pel)uVar3;
      uVar1 = uVar9;
      if ((int)uVar11 <= (int)uVar9) {
        uVar1 = uVar11;
      }
      uVar3 = (ulong)uVar1;
      if ((int)uVar9 < 0) {
        uVar3 = uVar8;
      }
      pDst[iVar5] = (pel)uVar3;
      iVar5 = iVar5 + 2;
      lVar6 = lVar6 + 0x200000000;
    }
    pDst = pDst + iDstStride;
    pSrc = pSrc + iSrcStride;
  }
  return;
}

Assistant:

void tscpm_linear_transform(pel *pSrc, int iSrcStride, pel *pDst, int iDstStride, int a_u, int b_u, int a_v, int b_v, int iShift, int uiWidth, int uiHeight, int bitDept)
{
    int maxResult = (1 << bitDept) - 1;

    iShift = (iShift >= 0 ? iShift : 0);

    for (int j = 0; j < uiHeight; j++)
    {
        for (int i = 0; i < uiWidth; i++)
        {
            int i2 = i << 1;
            int tempValue_u = (((s64)a_u * pSrc[i]) >> iShift) + b_u;
            int tempValue_v = (((s64)a_v * pSrc[i]) >> iShift) + b_v;
            pDst[i2    ] = COM_CLIP3(0, maxResult, tempValue_u);
            pDst[i2 + 1] = COM_CLIP3(0, maxResult, tempValue_v);
        }
        pDst += iDstStride;
        pSrc += iSrcStride;
    }
}